

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>
operator%(unsigned_long_long lhs,
         SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs)

{
  bool bVar1;
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> this;
  int in_ESI;
  unsigned_long_long in_RDI;
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> result;
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>
  in_stack_ffffffffffffffd8;
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe8;
  unsigned_long_long local_10;
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> local_8;
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> local_4;
  
  local_10 = in_RDI;
  local_8.m_int = in_ESI;
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt(&local_4);
  bVar1 = ModulusSimpleCaseHelper<int,_unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter,_0>
          ::ModulusSimpleCase(local_10,local_8,&local_4);
  if (!bVar1) {
    SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt
              ((SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &stack0xffffffffffffffd8,&local_10);
    SafeInt::operator_cast_to_int(in_stack_ffffffffffffffe0);
    this = SafeInt<unsigned_long_long,safeint_exception_handlers::SafeInt_InvalidParameter>::
           operator%((SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>
                      *)CONCAT44(local_8.m_int,in_stack_ffffffffffffffe8),
                     (int)((ulong)in_stack_ffffffffffffffe0 >> 0x20));
    SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
              ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)this.m_int,
               (SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
               in_stack_ffffffffffffffd8.m_int);
  }
  return (SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>)local_4.m_int;
}

Assistant:

SAFEINT_CONSTEXPR14 SafeInt< T, E > operator %( U lhs, SafeInt< T, E > rhs ) SAFEINT_CPP_THROW
{
    // Value of return depends on sign of lhs
    // This one may not be safe - bounds check in constructor
    // if lhs is negative and rhs is unsigned, this will throw an exception.

    // Fast-track the simple case
    // same size and same sign
    SafeInt< T, E > result;

    if( ModulusSimpleCaseHelper< T, U, E, (sizeof(T) == sizeof(U)) && ((bool)std::numeric_limits< T >::is_signed == (bool)std::numeric_limits< U >::is_signed) >::ModulusSimpleCase( lhs, rhs, result ) )
        return result;

    result = (SafeInt< U, E >(lhs) % (T)rhs);
    return result;
}